

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall MyClientConnection::MyClientConnection(MyClientConnection *this,MyClient *client)

{
  SDKConnection *in_RSI;
  undefined8 *in_RDI;
  
  tonk::SDKConnection::SDKConnection(in_RSI);
  *in_RDI = &PTR__MyClientConnection_0012ca10;
  *(undefined4 *)(in_RDI + 6) = 0;
  in_RDI[7] = in_RSI;
  test::OWDTimeStatistics::OWDTimeStatistics((OWDTimeStatistics *)(in_RDI + 8));
  in_RDI[0x3f1] = 0;
  *(undefined4 *)(in_RDI + 0x3f2) = 0;
  *(undefined4 *)((long)in_RDI + 0x1f94) = 0;
  return;
}

Assistant:

MyClientConnection(MyClient* client)
        : Client(client)
    {}